

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NC.hpp
# Opt level: O1

long __thiscall njoy::ENDFtk::section::Type<7,_2>::MixedElastic::NC(MixedElastic *this)

{
  long lVar1;
  
  lVar1 = CoherentElastic::NC(&this->coherent_);
  return (((long)(this->incoherent_).super_TabulationRecord.xValues.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish -
           (long)(this->incoherent_).super_TabulationRecord.xValues.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start >> 3) + 2) / 3 +
         lVar1 + (((long)*(pointer *)
                          ((long)&(this->incoherent_).super_TabulationRecord.super_InterpolationBase
                                  .boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                  _M_impl.super__Vector_impl_data + 8) -
                   (long)(this->incoherent_).super_TabulationRecord.super_InterpolationBase.
                         boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) + 2) / 3 + 1;
}

Assistant:

long NC() const {

  return this->coherent_.NC() + this->incoherent_.NC();
}